

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic.cpp
# Opt level: O2

void __thiscall SemanticTypes::visit(SemanticTypes *this,PointerExpNode *pointerExpNode)

{
  TokenNode *pTVar1;
  ExpNode *pEVar2;
  VarSymbol *pVVar3;
  ulong uVar4;
  char *__format;
  
  pTVar1 = pointerExpNode->id;
  if (pTVar1 == (TokenNode *)0x0) {
    uVar4 = (ulong)(uint)(pointerExpNode->exp->super_StmtNode).super_ASTNode.line;
    __format = "[SEMANTIC ERROR - pointerExpNode] NO RECORD ACCESS EXPRESSION, line %d\n";
  }
  else {
    (*(pTVar1->super_ExpNode).super_StmtNode.super_ASTNode._vptr_ASTNode[3])(pTVar1,this);
    pEVar2 = pointerExpNode->exp;
    if (pEVar2 == (ExpNode *)0x0) {
      uVar4 = (ulong)_DAT_00000008;
      __format = "[SEMANTIC ERROR - pointerExpNode] NO STRUCT ACCESS FIELD, line %d\n";
    }
    else {
      (*(pEVar2->super_StmtNode).super_ASTNode._vptr_ASTNode[3])(pEVar2,this);
      pEVar2 = pointerExpNode->exp;
      if ((pEVar2->pointer != false) && (pEVar2->arraySize < 1)) {
        pVVar3 = VarTable::searchInScope
                           (varTable,(pointerExpNode->id->super_ExpNode).lexeme,pEVar2->typeLexeme);
        if (pVVar3 != (VarSymbol *)0x0) {
          pTVar1 = pVVar3->type->id;
          (pointerExpNode->super_ExpNode).type = pTVar1->token;
          (pointerExpNode->super_ExpNode).typeLexeme = (pTVar1->super_ExpNode).typeLexeme;
          (pointerExpNode->super_ExpNode).pointer = pVVar3->pointer;
          (pointerExpNode->super_ExpNode).arraySize = pVVar3->arraySize;
          (pointerExpNode->super_ExpNode).lValue = true;
          return;
        }
        fprintf(_stderr,
                "[SEMANTIC ERROR - pointerExpNode] UNKNOWN FIELD IN STRUCT, line: %d field: %s type: %s\n"
                ,(ulong)(uint)(pointerExpNode->exp->super_StmtNode).super_ASTNode.line,
                (pointerExpNode->id->super_ExpNode).lexeme,pointerExpNode->exp->typeLexeme);
        return;
      }
      uVar4 = (ulong)(uint)(pEVar2->super_StmtNode).super_ASTNode.line;
      __format = "[SEMANTIC ERROR - pointerExpNode] INCORRECT ACCESS TO A STRUCT POINTER, line %d\n"
      ;
    }
  }
  fprintf(_stderr,__format,uVar4);
  return;
}

Assistant:

void SemanticTypes::visit(PointerExpNode *pointerExpNode) {
    if (pointerExpNode->getId()) {
        pointerExpNode->getId()->accept(this);
    } else {
        fprintf(stderr, "[SEMANTIC ERROR - pointerExpNode] NO RECORD ACCESS EXPRESSION, line %d\n",
                pointerExpNode->getExp()->getLine());
        return;
    }

    if (pointerExpNode->getExp()) {
        pointerExpNode->getExp()->accept(this);
    } else {
        fprintf(stderr, "[SEMANTIC ERROR - pointerExpNode] NO STRUCT ACCESS FIELD, line %d\n",
                pointerExpNode->getExp()->getLine());
        return;
    }

    if (!pointerExpNode->getExp()->isPointer() || pointerExpNode->getExp()->getArraySize() > 0) {
        fprintf(stderr, "[SEMANTIC ERROR - pointerExpNode] INCORRECT ACCESS TO A STRUCT POINTER, line %d\n",
                pointerExpNode->getExp()->getLine());
        return;
    }
    VarSymbol *recordField = varTable->searchInScope(pointerExpNode->getId()->getLexeme(),
                                                     pointerExpNode->getExp()->getTypeLexeme());

    if (!recordField) {
        fprintf(stderr, "[SEMANTIC ERROR - pointerExpNode] UNKNOWN FIELD IN STRUCT, line: %d field: %s type: %s\n",
                pointerExpNode->getExp()->getLine(), pointerExpNode->getId()->getLexeme(),
                pointerExpNode->getExp()->getTypeLexeme());
        return;
    }

    pointerExpNode->setType(recordField->getType()->getType());
    pointerExpNode->setTypeLexeme(recordField->getType()->getTypeLexeme());
    pointerExpNode->setPointer(recordField->isPointer());
    pointerExpNode->setArraySize(recordField->getArraySize());
    pointerExpNode->setLValue(true);
}